

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O1

void __thiscall
server::collectservmode::leavegame(collectservmode *this,clientinfo *ci,bool disconnecting)

{
  uint uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  token *ptVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  clientinfo *pcVar9;
  collectservmode *pcVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined7 in_register_00000011;
  int iVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  token *ptVar20;
  packetbuf p;
  int local_7c;
  packetbuf local_78;
  clientinfo *local_48;
  collectservmode *local_40;
  ulong local_38;
  
  (ci->state).tokens = 0;
  if ((int)CONCAT71(in_register_00000011,disconnecting) != 0) {
    local_48 = ci;
    iVar13 = strcmp(ci->team,"good");
    if (iVar13 == 0) {
      local_7c = 1;
    }
    else {
      iVar13 = strcmp(ci->team,"evil");
      local_7c = (uint)(iVar13 == 0) * 2;
    }
    iVar13 = (this->tokens).ulen;
    if (0 < iVar13) {
      iVar14 = 0;
      uVar16 = 0;
      local_40 = this;
      do {
        lVar18 = (long)iVar13 + -1;
        ptVar4 = (local_40->tokens).buf;
        ptVar20 = ptVar4 + lVar18;
        iVar15 = (int)uVar16;
        iVar11 = iVar13 + -1;
        if (ptVar4[lVar18].dropper == local_48->clientnum) {
          ptVar20->dropper = -0x80000000;
          if (ptVar20->team == local_7c) {
            iVar12 = iVar14 + 1;
            iVar15 = iVar14;
          }
          else {
            uVar16 = (ulong)(iVar15 + 1);
            iVar12 = iVar14;
          }
          iVar14 = iVar12;
          if (0xe < iVar15) {
            local_78.super_ucharbuf.buf = (uchar *)0x0;
            local_78.super_ucharbuf.len = 0;
            local_78.super_ucharbuf.maxlen = 0;
            local_78.super_ucharbuf.flags = '\0';
            local_78.growth = 300;
            local_38 = uVar16;
            local_78.packet = enet_packet_create((void *)0x0,300,1);
            local_78.super_ucharbuf.buf = (local_78.packet)->data;
            local_78.super_ucharbuf.maxlen = (int)(local_78.packet)->dataLength;
            putint(&local_78,0x6d);
            putint(&local_78,ptVar20->id);
            pcVar10 = local_40;
            pcVar9 = local_48;
            ptVar4 = (local_40->tokens).buf;
            iVar15 = (local_40->tokens).ulen;
            uVar1 = iVar15 - 1;
            (local_40->tokens).ulen = uVar1;
            if (1 < iVar15) {
              ptVar20 = ptVar4 + uVar1;
              iVar15 = ptVar20->id;
              iVar11 = ptVar20->team;
              uVar6 = *(undefined8 *)&ptVar20->droptime;
              puVar2 = (undefined8 *)((long)&ptVar4[uVar1].o.field_0 + 4);
              uVar7 = puVar2[1];
              puVar3 = (undefined8 *)((long)&ptVar4[lVar18].o.field_0 + 4);
              *puVar3 = *puVar2;
              puVar3[1] = uVar7;
              ptVar4 = ptVar4 + lVar18;
              ptVar4->id = iVar15;
              ptVar4->team = iVar11;
              *(undefined8 *)&ptVar4->droptime = uVar6;
            }
            uVar16 = local_38;
            if (1 < iVar13) {
              lVar17 = (long)iVar13 * 0x20 + -0x40;
              do {
                ptVar4 = (pcVar10->tokens).buf;
                if (*(int *)((long)&ptVar4->dropper + lVar17) == pcVar9->clientnum) {
                  *(undefined4 *)((long)&ptVar4->dropper + lVar17) = 0x80000000;
                  if (*(int *)((long)&ptVar4->team + lVar17) == local_7c) {
                    iVar15 = iVar14 + 1;
                    iVar13 = iVar14;
                  }
                  else {
                    iVar13 = (int)uVar16;
                    uVar16 = (ulong)(iVar13 + 1);
                    iVar15 = iVar14;
                  }
                  iVar14 = iVar15;
                  if (0xe < iVar13) {
                    putint(&local_78,*(int *)((long)&ptVar4->id + lVar17));
                    ptVar4 = (pcVar10->tokens).buf;
                    iVar13 = (pcVar10->tokens).ulen;
                    uVar1 = iVar13 - 1;
                    (pcVar10->tokens).ulen = uVar1;
                    if (1 < iVar13) {
                      uVar6 = *(undefined8 *)(ptVar4 + uVar1);
                      uVar7 = *(undefined8 *)&ptVar4[uVar1].droptime;
                      puVar2 = (undefined8 *)((long)&ptVar4[uVar1].o.field_0 + 4);
                      uVar8 = puVar2[1];
                      puVar3 = (undefined8 *)((long)&(ptVar4->o).field_0 + lVar17 + 4);
                      *puVar3 = *puVar2;
                      puVar3[1] = uVar8;
                      puVar2 = (undefined8 *)((long)&ptVar4->id + lVar17);
                      *puVar2 = uVar6;
                      puVar2[1] = uVar7;
                    }
                  }
                }
                lVar17 = lVar17 + -0x20;
                lVar19 = lVar18 + -1;
                bVar5 = 0 < lVar18;
                lVar18 = lVar19;
              } while (lVar19 != 0 && bVar5);
            }
            putint(&local_78,-1);
            enet_packet_resize(local_78.packet,(long)local_78.super_ucharbuf.len);
            local_78.super_ucharbuf.buf = (local_78.packet)->data;
            local_78.super_ucharbuf.maxlen = (int)(local_78.packet)->dataLength;
            sendpacket(-1,1,local_78.packet,-1);
            if (((0 < local_78.growth) && (local_78.packet != (ENetPacket *)0x0)) &&
               ((local_78.packet)->referenceCount == 0)) {
              enet_packet_destroy(local_78.packet);
              local_78.packet = (ENetPacket *)0x0;
            }
            iVar11 = -1;
          }
        }
        iVar13 = iVar11;
        uVar16 = uVar16 & 0xffffffff;
      } while (0 < iVar13);
    }
  }
  return;
}

Assistant:

void leavegame(clientinfo *ci, bool disconnecting = false)
    {
        ci->state.tokens = 0;
        if(disconnecting)
        {
            int team = collectteambase(ci->team), totalfriendly = 0, totalenemy = 0;
            loopvrev(tokens)
            {
                token &t = tokens[i];
                if(t.dropper == ci->clientnum) t.dropper = INT_MIN; else if(t.dropper > INT_MIN) continue;
                if(t.team == team ? ++totalfriendly > UNOWNEDTOKENLIMIT : ++totalenemy > UNOWNEDTOKENLIMIT)
                {
                    packetbuf p(300, ENET_PACKET_FLAG_RELIABLE);
                    putint(p, N_EXPIRETOKENS);
                    putint(p, t.id);
                    tokens.removeunordered(i);
                    while(--i >= 0)
                    {
                        token &t = tokens[i];
                        if(t.dropper == ci->clientnum) t.dropper = INT_MIN; else if(t.dropper > INT_MIN) continue;
                        if(t.team == team ? ++totalfriendly > UNOWNEDTOKENLIMIT : ++totalenemy > UNOWNEDTOKENLIMIT)
                        {
                            putint(p, t.id);
                            tokens.removeunordered(i);
                        }
                    }
                    putint(p, -1);
                    sendpacket(-1, 1, p.finalize());
                }
            }
        }
    }